

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O2

MPP_RET h264d_parse(void *decoder,HalDecTask *in_task)

{
  int *piVar1;
  void *__s;
  long lVar2;
  MPP_RET MVar3;
  ulong uVar4;
  ulong uVar5;
  
  in_task->valid = 0;
  *(HalDecTask **)((long)decoder + 0xa8) = in_task;
  *(undefined8 *)((long)decoder + 0xbc) = 0;
  *(undefined1 *)((long)decoder + 0x5e) = 0;
  __s = *(void **)(*(long *)((long)decoder + 0x40) + 0x1910);
  if (__s != (void *)0x0) {
    memset(__s,0,0xf8);
  }
  MVar3 = parse_loop((H264_DecCtx_t *)decoder);
  if (MVar3 != MPP_OK) {
    *(byte *)&in_task->flags = *(byte *)&in_task->flags | 4;
  }
  if (*(char *)((long)decoder + 0x5e) != '\0') {
    *(undefined1 *)((long)decoder + 0x5e) = 0;
    piVar1 = (int *)(*(long *)((long)decoder + 0x48) + 0xcf0);
    *piVar1 = *piVar1 + 1;
    MVar3 = update_dpb((H264_DecCtx_t *)decoder);
    uVar4 = (in_task->flags).val;
    if (MVar3 != MPP_OK) {
      uVar4 = uVar4 | 8;
      (in_task->flags).val = uVar4;
    }
    if ((uVar4 & 1) != 0) {
      h264d_flush_dpb_eos((H264_DecCtx_t *)decoder);
    }
  }
  in_task->valid = 1;
  uVar4 = (in_task->flags).val;
  if ((uVar4 & 4) == 0) {
    lVar2 = *(long *)((long)decoder + 0x30);
    (in_task->syntax).number = *(RK_U32 *)(lVar2 + 0xbc0);
    (in_task->syntax).data = *(void **)(lVar2 + 0xbc8);
    uVar5 = (ulong)((*(uint *)((long)decoder + 0xc0) & 1) << 4);
    (in_task->flags).val = uVar4 & 0xffffffffffffffeb | uVar5;
    (in_task->flags).val =
         uVar4 & 0xffffffffffffffe3 | uVar5 |
         (ulong)(byte)((byte)(((uint)uVar4 & 8) >> 3) |
                      (*(int *)((long)decoder + 0xbc) != 0 || *(int *)((long)decoder + 0xc4) != 0))
         << 3;
  }
  return MVar3;
}

Assistant:

MPP_RET h264d_parse(void *decoder, HalDecTask *in_task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;
    H264dErrCtx_t *p_err = &p_Dec->errctx;

    in_task->valid = 0;
    p_Dec->in_task = in_task;
    p_err->cur_err_flag  = 0;
    p_err->used_ref_flag = 0;
    p_Dec->is_parser_end = 0;
    if (p_Dec->p_Cur->sei)
        memset(p_Dec->p_Cur->sei, 0, sizeof(*p_Dec->p_Cur->sei));

    ret = parse_loop(p_Dec);
    if (ret) {
        in_task->flags.parse_err = 1;
    }

    if (p_Dec->is_parser_end) {
        p_Dec->is_parser_end = 0;
        p_Dec->p_Vid->g_framecnt++;
        ret = update_dpb(p_Dec);
        if (ret) {
            in_task->flags.ref_err = 1;
        }
        if (in_task->flags.eos) {
            h264d_flush_dpb_eos(p_Dec);
        }
    }
    in_task->valid = 1;
    if (!in_task->flags.parse_err) {
        in_task->syntax.number = p_Dec->dxva_ctx->syn.num;
        in_task->syntax.data   = (void *)p_Dec->dxva_ctx->syn.buf;
        in_task->flags.used_for_ref = p_err->used_ref_flag;
        in_task->flags.ref_err |= (p_err->dpb_err_flag | p_err->cur_err_flag) ? 1 : 0;
    }

    return ret;
}